

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_flattened_access_chain_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  SPIRVariable *pSVar1;
  SPIRExpression *pSVar2;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (pSVar1 == (SPIRVariable *)0x0) {
    pSVar2 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
    if (pSVar2 != (SPIRExpression *)0x0) {
      ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    to_expression_abi_cxx11_(&sStack_38,this,id,true);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&sStack_38,this,(ulong)(pSVar1->super_IVariant).self.id,1);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::to_flattened_access_chain_expression(uint32_t id)
{
	// Do not use to_expression as that will unflatten access chains.
	string basename;
	if (const auto *var = maybe_get<SPIRVariable>(id))
		basename = to_name(var->self);
	else if (const auto *expr = maybe_get<SPIRExpression>(id))
		basename = expr->expression;
	else
		basename = to_expression(id);

	return basename;
}